

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SwapFieldsImpl<false>
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  MessageFactory *pMVar3;
  pointer ppFVar4;
  FieldDescriptor *field;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  LogMessage *pLVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar9;
  _Base_ptr p_Var10;
  OneofDescriptor *oneof_descriptor;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  pointer ppFVar13;
  int oneof_index;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  int local_dc;
  MessageLite *local_d8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d0;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (message1 != message2) {
    (*(message1->super_MessageLite)._vptr_MessageLite[0x11])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d1);
      pLVar8 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar8 = internal::LogMessage::operator<<(pLVar8,"First argument to SwapFields() (of type \"")
      ;
      iVar5 = (*(message1->super_MessageLite)._vptr_MessageLite[0x11])(message1);
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,(string *)(*(long *)(CONCAT44(extraout_var,iVar5) + 8) + 0x20));
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,(string *)(*(long *)(this->descriptor_ + 8) + 0x20));
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar8);
      internal::LogMessage::~LogMessage(&local_68);
    }
    (*(message2->super_MessageLite)._vptr_MessageLite[0x11])();
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d9);
      pLVar8 = internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,"Second argument to SwapFields() (of type \"");
      iVar5 = (*(message2->super_MessageLite)._vptr_MessageLite[0x11])();
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,(string *)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 8) + 0x20));
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,(string *)(*(long *)(this->descriptor_ + 8) + 0x20));
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar8);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d0._M_impl.super__Rb_tree_header._M_header;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar3 = this->message_factory_;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar5 = (*(message1->super_MessageLite)._vptr_MessageLite[0x11])(message1);
    iVar5 = (*pMVar3->_vptr_MessageFactory[2])(pMVar3,CONCAT44(extraout_var_01,iVar5));
    local_d8 = (MessageLite *)CONCAT44(extraout_var_02,iVar5);
    ppFVar13 = (fields->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar13 != ppFVar4) {
      do {
        field = *ppFVar13;
        if (((byte)field[1] & 8) == 0) {
          lVar9 = *(long *)(field + 0x28);
          if ((lVar9 == 0 || ((byte)field[1] & 0x10) == 0) ||
             ((*(int *)(lVar9 + 4) == 1 && ((*(byte *)(*(long *)(lVar9 + 0x20) + 1) & 2) != 0)))) {
            SwapField(this,message1,message2,field);
            if ((~(byte)field[1] & 0x60) != 0) {
              SwapBit(this,message1,message2,field);
            }
          }
          else {
            if (((byte)field[1] & 0x10) == 0) {
              lVar9 = 0;
            }
            iVar5 = (int)((ulong)(lVar9 - *(long *)(*(long *)(lVar9 + 0x10) + 0x30)) >> 3);
            local_dc = iVar5 * -0x33333333;
            p_Var10 = &local_d0._M_impl.super__Rb_tree_header._M_header;
            for (p_Var11 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
                (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
                p_Var11 = (&p_Var11->_M_left)[iVar2 < local_dc]) {
              iVar2 = (int)*(size_t *)(p_Var11 + 1);
              if (SBORROW4(iVar2,local_dc) == iVar2 + iVar5 * 0x33333333 < 0) {
                p_Var10 = p_Var11;
              }
            }
            p_Var1 = &local_d0._M_impl.super__Rb_tree_header;
            p_Var12 = p_Var1;
            if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
               (p_Var12 = (_Rb_tree_header *)p_Var10,
               local_dc < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
              p_Var12 = p_Var1;
            }
            if (p_Var12 == p_Var1) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_d0,&local_dc);
              if (((byte)field[1] & 0x10) == 0) {
                oneof_descriptor = (OneofDescriptor *)0x0;
              }
              else {
                oneof_descriptor = *(OneofDescriptor **)(field + 0x28);
              }
              SwapOneofField<false>(this,message1,message2,oneof_descriptor);
            }
          }
        }
        else {
          uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          internal::ExtensionSet::SwapExtension
                    ((ExtensionSet *)
                     ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
                     local_d8,(ExtensionSet *)
                              ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar7
                              ),*(int *)(field + 4));
        }
        ppFVar13 = ppFVar13 + 1;
      } while (ppFVar13 != ppFVar4);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_d0);
  }
  return;
}

Assistant:

void Reflection::SwapFieldsImpl(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to SwapFields() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to SwapFields() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  std::set<int> swapped_oneof;

  GOOGLE_DCHECK(!unsafe_shallow_swap || message1->GetArenaForAllocation() ==
                                     message2->GetArenaForAllocation());

  const Message* prototype =
      message_factory_->GetPrototype(message1->GetDescriptor());
  for (const auto* field : fields) {
    CheckInvalidAccess(schema_, field);
    if (field->is_extension()) {
      if (unsafe_shallow_swap) {
        MutableExtensionSet(message1)->UnsafeShallowSwapExtension(
            MutableExtensionSet(message2), field->number());
      } else {
        MutableExtensionSet(message1)->SwapExtension(
            prototype, MutableExtensionSet(message2), field->number());
      }
    } else {
      if (schema_.InRealOneof(field)) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField<unsafe_shallow_swap>(message1, message2,
                                            field->containing_oneof());
      } else {
        // Swap field.
        if (unsafe_shallow_swap) {
          UnsafeShallowSwapField(message1, message2, field);
        } else {
          SwapField(message1, message2, field);
        }
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already. This has to be done after SwapField, because SwapField
        // may depend on the information in has bits.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
      }
    }
  }
}